

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

void nn_bws_destroy(void *self)

{
  long in_RDI;
  nn_bws *bws;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_BWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0xaa);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_term((nn_list *)0x1ee94c);
  if (*(long *)(in_RDI + 0x2c8) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bws->aws == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0xac);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_usock_term((nn_usock *)0x1ee9c0);
  nn_fsm_term((nn_fsm *)0x1ee9ca);
  nn_free((void *)0x1ee9d4);
  return;
}

Assistant:

static void nn_bws_destroy (void *self)
{
    struct nn_bws *bws = self;

    nn_assert_state (bws, NN_BWS_STATE_IDLE);
    nn_list_term (&bws->awss);
    nn_assert (bws->aws == NULL);
    nn_usock_term (&bws->usock);
    nn_fsm_term (&bws->fsm);

    nn_free (bws);
}